

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cpp
# Opt level: O3

void foundit(skiplist<DictKey,_std::less<DictKey>_> *s,DictKey *x)

{
  pointer pcVar1;
  ostream *poVar2;
  long *plVar3;
  iterator itr;
  iterator local_58;
  undefined1 local_40 [8];
  _Alloc_hider local_38;
  char local_28 [16];
  
  local_40._0_4_ = x->key_;
  pcVar1 = (x->value_)._M_dataplus._M_p;
  local_38._M_p = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + (x->value_)._M_string_length);
  skiplist<DictKey,_std::less<DictKey>_>::find(&local_58,s,(DictKey *)local_40);
  if (local_38._M_p != local_28) {
    operator_delete(local_38._M_p);
  }
  if ((local_58.node == (SLNode<DictKey> *)0x0) && (local_58.node_count_ == 0)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not found: ",0xb);
    poVar2 = operator<<((ostream *)&std::cout,x);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Value: ",7);
    poVar2 = operator<<((ostream *)&std::cout,&(local_58.node)->val);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," Count: ",8);
    plVar3 = (long *)std::ostream::operator<<((ostream *)poVar2,(local_58.node)->count);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
  }
  return;
}

Assistant:

void foundit(skiplist<DictKey> &s, DictKey x) {
  skiplist<DictKey>::iterator itr = s.find(x);
  if (itr != std::end(s))
    std::cout << "Value: " << itr.node->val << " Count: " << itr.node->count
         << std::endl;
  else
    std::cout << "Not found: " << x << "\n";
}